

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O3

void __thiscall spvtools::opt::IRContext::BuildRegPressureAnalysis(IRContext *this)

{
  byte *pbVar1;
  pointer __p;
  pointer __p_00;
  __uniq_ptr_impl<spvtools::opt::LivenessAnalysis,_std::default_delete<spvtools::opt::LivenessAnalysis>_>
  local_18;
  
  __p_00 = (pointer)operator_new(0x40);
  __p_00->context_ = this;
  (__p_00->analysis_cache_)._M_h._M_buckets = &(__p_00->analysis_cache_)._M_h._M_single_bucket;
  (__p_00->analysis_cache_)._M_h._M_bucket_count = 1;
  (__p_00->analysis_cache_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__p_00->analysis_cache_)._M_h._M_element_count = 0;
  (__p_00->analysis_cache_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__p_00->analysis_cache_)._M_h._M_rehash_policy._M_next_resize = 0;
  (__p_00->analysis_cache_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_18._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::LivenessAnalysis_*,_std::default_delete<spvtools::opt::LivenessAnalysis>_>
  .super__Head_base<0UL,_spvtools::opt::LivenessAnalysis_*,_false>._M_head_impl =
       (tuple<spvtools::opt::LivenessAnalysis_*,_std::default_delete<spvtools::opt::LivenessAnalysis>_>
        )(_Tuple_impl<0UL,_spvtools::opt::LivenessAnalysis_*,_std::default_delete<spvtools::opt::LivenessAnalysis>_>
          )0x0;
  std::
  __uniq_ptr_impl<spvtools::opt::LivenessAnalysis,_std::default_delete<spvtools::opt::LivenessAnalysis>_>
  ::reset((__uniq_ptr_impl<spvtools::opt::LivenessAnalysis,_std::default_delete<spvtools::opt::LivenessAnalysis>_>
           *)&this->reg_pressure_,__p_00);
  std::
  unique_ptr<spvtools::opt::LivenessAnalysis,_std::default_delete<spvtools::opt::LivenessAnalysis>_>
  ::~unique_ptr((unique_ptr<spvtools::opt::LivenessAnalysis,_std::default_delete<spvtools::opt::LivenessAnalysis>_>
                 *)&local_18);
  pbVar1 = (byte *)((long)&this->valid_analyses_ + 1);
  *pbVar1 = *pbVar1 | 2;
  return;
}

Assistant:

void BuildRegPressureAnalysis() {
    reg_pressure_ = MakeUnique<LivenessAnalysis>(this);
    valid_analyses_ = valid_analyses_ | kAnalysisRegisterPressure;
  }